

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O3

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                  PipelineStateDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  Uint64 UVar2;
  ShaderResourceVariableDesc *pSVar3;
  ImmutableSamplerDesc *pIVar4;
  PIPELINE_TYPE PVar5;
  undefined3 uVar6;
  Uint32 UVar7;
  SHADER_RESOURCE_VARIABLE_TYPE SVar8;
  undefined3 uVar9;
  SHADER_TYPE SVar10;
  Uint32 UVar11;
  undefined4 uVar12;
  Uint32 UVar13;
  undefined4 uVar14;
  int iVar15;
  size_t sVar16;
  IMemoryAllocator *pIVar17;
  char *pcVar18;
  undefined4 extraout_var_00;
  PipelineStateDesc *Args_1;
  RefCountersImpl *this_00;
  RenderDeviceVkImpl *pRVar19;
  string msg;
  string local_48;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  RefCountedObject<Diligent::IPipelineStateVk>::RefCountedObject<>
            ((RefCountedObject<Diligent::IPipelineStateVk> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IPipelineStateVk>).
  super_RefCountedObject<Diligent::IPipelineStateVk>.super_IPipelineStateVk.super_IPipelineState.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00aebfe0;
  this->m_pDevice = pDevice;
  PVar5 = ObjDesc->PipelineType;
  uVar6 = *(undefined3 *)&ObjDesc->field_0x9;
  UVar7 = ObjDesc->SRBAllocationGranularity;
  UVar2 = ObjDesc->ImmediateContextMask;
  SVar8 = (ObjDesc->ResourceLayout).DefaultVariableType;
  uVar9 = *(undefined3 *)&(ObjDesc->ResourceLayout).field_0x1;
  SVar10 = (ObjDesc->ResourceLayout).DefaultVariableMergeStages;
  UVar11 = (ObjDesc->ResourceLayout).NumVariables;
  uVar12 = *(undefined4 *)&(ObjDesc->ResourceLayout).field_0xc;
  pSVar3 = (ObjDesc->ResourceLayout).Variables;
  UVar13 = (ObjDesc->ResourceLayout).NumImmutableSamplers;
  uVar14 = *(undefined4 *)&(ObjDesc->ResourceLayout).field_0x1c;
  pIVar4 = (ObjDesc->ResourceLayout).ImmutableSamplers;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).PipelineType = PVar5;
  *(undefined3 *)&(this->m_Desc).field_0x9 = uVar6;
  (this->m_Desc).SRBAllocationGranularity = UVar7;
  (this->m_Desc).ImmediateContextMask = UVar2;
  (this->m_Desc).ResourceLayout.DefaultVariableType = SVar8;
  *(undefined3 *)&(this->m_Desc).ResourceLayout.field_0x1 = uVar9;
  (this->m_Desc).ResourceLayout.DefaultVariableMergeStages = SVar10;
  (this->m_Desc).ResourceLayout.NumVariables = UVar11;
  *(undefined4 *)&(this->m_Desc).ResourceLayout.field_0xc = uVar12;
  (this->m_Desc).ResourceLayout.Variables = pSVar3;
  (this->m_Desc).ResourceLayout.NumImmutableSamplers = UVar13;
  *(undefined4 *)&(this->m_Desc).ResourceLayout.field_0x1c = uVar14;
  (this->m_Desc).ResourceLayout.ImmutableSamplers = pIVar4;
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    iVar15 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_UniqueId;
    iVar15 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar15 = iVar15 + 1;
  }
  this->m_UniqueID = iVar15;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    pRVar19 = this->m_pDevice;
    if (pRVar19 == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",(char (*) [21])Args_1);
      Args_1 = (PipelineStateDesc *)0x47;
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      pRVar19 = this->m_pDevice;
    }
    this_00 = (pRVar19->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
              super_ObjectBase<Diligent::IRenderDeviceVk>.
              super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters;
    if (this_00 == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",(char (*) [26])Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      this_00 = (pRVar19->
                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                super_ObjectBase<Diligent::IRenderDeviceVk>.
                super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters;
    }
    RefCountersImpl::AddStrongRef(this_00);
  }
  pcVar18 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar18 == (char *)0x0) {
    pIVar17 = GetStringAllocator();
    iVar15 = (**pIVar17->_vptr_IMemoryAllocator)
                       (pIVar17,0x13,"Object address string",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x55);
    pcVar18 = (char *)CONCAT44(extraout_var_00,iVar15);
    snprintf(pcVar18,0x13,"0x%llX",this);
  }
  else {
    sVar16 = strlen(pcVar18);
    pIVar17 = GetStringAllocator();
    iVar15 = (**pIVar17->_vptr_IMemoryAllocator)
                       (pIVar17,sVar16 + 1,"Object name copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x4e);
    pcVar18 = (char *)CONCAT44(extraout_var,iVar15);
    memcpy(pcVar18,(ObjDesc->super_DeviceObjectAttribs).Name,sVar16 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar18;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }